

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O3

sub_idx_t __thiscall
lf::base::RefEl::SubSubEntity2SubEntity
          (RefEl *this,dim_t sub_codim,sub_idx_t sub_index,dim_t sub_rel_codim,
          sub_idx_t sub_rel_index)

{
  dim_t dVar1;
  size_type sVar2;
  sub_idx_t sVar3;
  runtime_error *this_00;
  array<std::array<unsigned_int,_2UL>,_3UL> *paVar4;
  RefEl local_29;
  
  dVar1 = internal::DimensionImpl(this->type_);
  if (dVar1 < sub_codim) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"sub_codim > Dimension");
  }
  else {
    sVar2 = NumSubEntities(this,sub_codim);
    if (sVar2 < sub_index) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"sub_index >= NumSubEntities");
    }
    else {
      dVar1 = internal::DimensionImpl(this->type_);
      if (dVar1 - sub_codim < sub_rel_codim) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"subSubCodim out of bounds.");
      }
      else {
        local_29 = SubType(this,sub_codim,sub_index);
        sVar2 = NumSubEntities(&local_29,sub_rel_codim);
        if (sub_rel_index < sVar2) {
          sVar3 = 0;
          if (((this->type_ != kPoint) && (sVar3 = sub_rel_index, sub_codim != 0)) &&
             (dVar1 = internal::DimensionImpl(this->type_), sVar3 = sub_index, dVar1 != sub_codim))
          {
            if (this->type_ == kQuad) {
              paVar4 = (array<std::array<unsigned_int,_2UL>,_3UL> *)&sub_sub_entity_index_quad_;
            }
            else {
              if (this->type_ != kTria) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"This code should never be reached.");
                goto LAB_0012337f;
              }
              paVar4 = &sub_sub_entity_index_tria_;
            }
            sVar3 = ((array<std::array<unsigned_int,_2UL>,_4UL> *)paVar4)->_M_elems[sub_index].
                    _M_elems[sub_rel_index];
          }
          return sVar3;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"sub_sub_index out of bounds.");
      }
    }
  }
LAB_0012337f:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] constexpr sub_idx_t SubSubEntity2SubEntity(
      dim_t sub_codim, sub_idx_t sub_index, dim_t sub_rel_codim,
      sub_idx_t sub_rel_index) const {
    LF_ASSERT_MSG_CONSTEXPR(sub_codim >= 0, "sub_codim negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_codim <= Dimension(), "sub_codim > Dimension");
    LF_ASSERT_MSG_CONSTEXPR(sub_index >= 0, "sub_index negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_index <= NumSubEntities(sub_codim),
                            "sub_index >= NumSubEntities");
    LF_ASSERT_MSG_CONSTEXPR(sub_rel_codim >= 0, "sub_rel_codim negative.");
    LF_ASSERT_MSG_CONSTEXPR(sub_rel_codim <= Dimension() - sub_codim,
                            "subSubCodim out of bounds.");
    LF_ASSERT_MSG_CONSTEXPR(sub_rel_index >= 0, "sub_rel_index negative.");
    LF_ASSERT_MSG_CONSTEXPR(
        sub_rel_index <
            SubType(sub_codim, sub_index).NumSubEntities(sub_rel_codim),
        "sub_sub_index out of bounds.");

    if (type_ == RefElType::kPoint) {
      return 0;
    }
    if (sub_codim == 0) {
      return sub_rel_index;
    }
    if (sub_codim == Dimension()) {
      return sub_index;
    }

    // from here on, it must be a segment
    switch (type_) {
      case RefElType::kTria:
        return sub_sub_entity_index_tria_[sub_index][sub_rel_index];
      case RefElType::kQuad:
        return sub_sub_entity_index_quad_[sub_index][sub_rel_index];
      default:
        LF_ASSERT_MSG_CONSTEXPR(false, "This code should never be reached.");
    }

    return 0;  // Prevent warnings from compiler...
  }